

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTxyz.cpp
# Opt level: O2

void __thiscall OpenMD::NPTxyz::scaleSimBox(NPTxyz *this)

{
  long lVar1;
  long lVar2;
  double (*this_00) [3];
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Mat3x3d scaleMat;
  Mat3x3d hmat;
  Mat3x3d hmnew;
  Mat3x3d hm;
  SquareMatrix3<double> local_180;
  RectMatrix<double,_3U,_3U> local_138;
  RectMatrix<double,_3U,_3U> local_f0;
  SquareMatrix<double,_3> local_a8;
  SquareMatrix<double,_3> local_60;
  
  this_00 = (double (*) [3])&local_180;
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)this_00);
  SquareMatrix<double,_3>::SquareMatrix(&local_60);
  SquareMatrix<double,_3>::SquareMatrix(&local_a8);
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar3 = 1.0;
      if (lVar1 != lVar2) {
        dVar3 = 0.0;
      }
      ((RectMatrix<double,_3U,_3U> *)*this_00)->data_[0][lVar2] = dVar3;
    }
    this_00 = this_00 + 1;
  }
  dVar3 = 1.0;
  dVar5 = 1.0;
  for (lVar1 = 0; lVar1 != 0x60; lVar1 = lVar1 + 0x20) {
    dVar4 = exp((this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.dt *
                *(double *)
                 ((long)(this->super_NPTf).eta.super_SquareMatrix<double,_3>.
                        super_RectMatrix<double,_3U,_3U>.data_[0] + lVar1));
    *(double *)
     ((long)local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
     lVar1) = dVar4;
    dVar6 = dVar4;
    if (dVar4 <= dVar5) {
      dVar6 = dVar5;
    }
    if (dVar3 <= dVar4) {
      dVar4 = dVar3;
    }
    dVar3 = dVar4;
    dVar5 = dVar6;
  }
  if ((1.1 < dVar5) || (dVar3 < 0.9)) {
    snprintf(painCave.errMsg,2000,
             "NPTxyz error: Attempting a Box scaling of more than 10 percent.\n Check your tauBarostat, as it is probably too small!\n\n scaleMat = [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n            [%lf\t%lf\t%lf]\n"
             ,local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0],
             local_180.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1]);
    painCave.isFatal = 1;
    simError();
  }
  else {
    Snapshot::getHmat((Mat3x3d *)&local_f0,
                      (this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.
                      snap);
    operator*((SquareMatrix3<double> *)&local_138,(SquareMatrix3<double> *)&local_f0,&local_180);
    RectMatrix<double,_3U,_3U>::operator=(&local_f0,&local_138);
    Snapshot::setHmat((this->super_NPTf).super_NPT.super_VelocityVerletIntegrator.super_Integrator.
                      snap,(Mat3x3d *)&local_f0);
  }
  return;
}

Assistant:

void NPTxyz::scaleSimBox() {
    int i, j;
    Mat3x3d scaleMat;
    RealType scaleFactor;
    RealType bigScale, smallScale;
    Mat3x3d hm;
    Mat3x3d hmnew;

    // Scale the box after all the positions have been moved:

    // Use a taylor expansion for eta products:  Hmat = Hmat . exp(dt * etaMat)
    //  Hmat = Hmat . ( Ident + dt * etaMat  + dt^2 * etaMat*etaMat / 2)

    bigScale   = 1.0;
    smallScale = 1.0;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        scaleMat(i, j) = 0.0;
        if (i == j) { scaleMat(i, j) = 1.0; }
      }
    }

    for (i = 0; i < 3; i++) {
      // calculate the scaleFactors

      scaleFactor = exp(dt * eta(i, i));

      scaleMat(i, i) = scaleFactor;

      if (scaleMat(i, i) > bigScale) { bigScale = scaleMat(i, i); }

      if (scaleMat(i, i) < smallScale) { smallScale = scaleMat(i, i); }
    }

    if ((bigScale > 1.1) || (smallScale < 0.9)) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "NPTxyz error: Attempting a Box scaling of more than 10 percent.\n"
          " Check your tauBarostat, as it is probably too small!\n\n"
          " scaleMat = [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n"
          "            [%lf\t%lf\t%lf]\n",
          scaleMat(0, 0), scaleMat(0, 1), scaleMat(0, 2), scaleMat(1, 0),
          scaleMat(1, 1), scaleMat(1, 2), scaleMat(2, 0), scaleMat(2, 1),
          scaleMat(2, 2));
      painCave.isFatal = 1;
      simError();
    } else {
      Mat3x3d hmat = snap->getHmat();
      hmat         = hmat * scaleMat;
      snap->setHmat(hmat);
    }
  }